

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::DescriptorScriptPubKeyMan::CanUpdateToWalletDescriptor
          (DescriptorScriptPubKeyMan *this,WalletDescriptor *descriptor,string *error)

{
  bool bVar1;
  int *in_R8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock81;
  int local_54;
  unique_lock<std::recursive_mutex> local_50;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_50._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_50);
  bVar1 = HasWalletDescriptor(this,descriptor);
  if (bVar1) {
    if (((this->m_wallet_descriptor).range_start < descriptor->range_start) ||
       (bVar1 = true, descriptor->range_end < (this->m_wallet_descriptor).range_end)) {
      local_54 = (this->m_wallet_descriptor).range_end + -1;
      tinyformat::format<int,int>
                (&local_40,(tinyformat *)"new range must include current range = [%d,%d]",
                 (char *)&(this->m_wallet_descriptor).range_start,&local_54,in_R8);
      CanUpdateToWalletDescriptor();
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (error,0,error->_M_string_length,"can only update matching descriptor",0x23);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::CanUpdateToWalletDescriptor(const WalletDescriptor& descriptor, std::string& error)
{
    LOCK(cs_desc_man);
    if (!HasWalletDescriptor(descriptor)) {
        error = "can only update matching descriptor";
        return false;
    }

    if (descriptor.range_start > m_wallet_descriptor.range_start ||
        descriptor.range_end < m_wallet_descriptor.range_end) {
        // Use inclusive range for error
        error = strprintf("new range must include current range = [%d,%d]",
                          m_wallet_descriptor.range_start,
                          m_wallet_descriptor.range_end - 1);
        return false;
    }

    return true;
}